

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchpriority.cpp
# Opt level: O1

void ScheduleBatchPriority(void)

{
  string_view source_file;
  bool bVar1;
  int iVar2;
  pthread_t __target_thread;
  Logger *pLVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string log_msg;
  int in_stack_fffffffffffffeec;
  long *local_e8 [2];
  long local_d8 [14];
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  __target_thread = pthread_self();
  iVar2 = pthread_setschedparam(__target_thread,3,(sched_param *)&ScheduleBatchPriority::param);
  if (iVar2 != 0) {
    SysErrorString_abi_cxx11_(in_stack_fffffffffffffeec);
    pLVar3 = LogInstance();
    bVar1 = BCLog::Logger::Enabled(pLVar3);
    if (bVar1) {
      local_48._M_string_length = 0;
      local_48.field_2._M_local_buf[0] = '\0';
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      tinyformat::format<std::__cxx11::string>
                (&local_68,(tinyformat *)"Failed to pthread_setschedparam: %s\n",(char *)local_e8,
                 in_RCX);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_48,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      pLVar3 = LogInstance();
      local_68._M_dataplus._M_p = (pointer)0x5f;
      local_68._M_string_length = 0x1169b96;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/batchpriority.cpp"
      ;
      source_file._M_len = 0x5f;
      str._M_str = local_48._M_dataplus._M_p;
      str._M_len = local_48._M_string_length;
      logging_function._M_str = "ScheduleBatchPriority";
      logging_function._M_len = 0x15;
      BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x17,ALL,Info);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,
                        CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                 local_48.field_2._M_local_buf[0]) + 1);
      }
    }
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0],local_d8[0] + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ScheduleBatchPriority()
{
#ifdef SCHED_BATCH
    const static sched_param param{};
    const int rc = pthread_setschedparam(pthread_self(), SCHED_BATCH, &param);
    if (rc != 0) {
        LogPrintf("Failed to pthread_setschedparam: %s\n", SysErrorString(rc));
    }
#endif
}